

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O3

SPxId __thiscall
soplex::
SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::buildBestPriceVectorEnterDim
          (SPxDevexPR<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *best,
          number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *feastol)

{
  uint *puVar1;
  int iVar2;
  pointer pnVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  int iVar11;
  uint uVar12;
  int *piVar13;
  pointer pIVar14;
  DataKey DVar15;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar16;
  pointer keys;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *tol;
  long lVar17;
  ulong uVar18;
  cpp_dec_float<100U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  pointer local_1e0;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_17c [12];
  uint auStack_170 [2];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  uint local_148 [3];
  undefined3 uStack_13b;
  int iStack_138;
  bool bStack_134;
  undefined8 local_130;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  devexpr local_88 [8];
  uint auStack_80 [2];
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  undefined8 uStack_50;
  int local_48;
  undefined1 local_44;
  fpclass_type local_40;
  int32_t iStack_3c;
  
  local_238.fpclass = cpp_dec_float_finite;
  local_238.prec_elem = 0x10;
  local_238.data._M_elems[0] = 0;
  local_238.data._M_elems[1] = 0;
  local_238.data._M_elems[2] = 0;
  local_238.data._M_elems[3] = 0;
  local_238.data._M_elems[4] = 0;
  local_238.data._M_elems[5] = 0;
  local_238.data._M_elems[6] = 0;
  local_238.data._M_elems[7] = 0;
  local_238.data._M_elems[8] = 0;
  local_238.data._M_elems[9] = 0;
  local_238.data._M_elems[10] = 0;
  local_238.data._M_elems[0xb] = 0;
  local_238.data._M_elems[0xc] = 0;
  local_238.data._M_elems[0xd] = 0;
  local_238.data._M_elems._56_5_ = 0;
  local_238.data._M_elems[0xf]._1_3_ = 0;
  local_238.exp = 0;
  local_238.neg = false;
  pSVar16 = (this->
            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).thesolver;
  pnVar3 = (pSVar16->theCoTest).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_1e0 = (pSVar16->coWeights).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_130._0_4_ = cpp_dec_float_finite;
  local_130._4_4_ = 0x10;
  stack0xfffffffffffffe88 = (undefined1  [16])0x0;
  local_168 = (undefined1  [16])0x0;
  local_158 = (undefined1  [16])0x0;
  local_148[0] = 0;
  local_148[1] = 0;
  stack0xfffffffffffffec0 = 0;
  uStack_13b = 0;
  iStack_138 = 0;
  bStack_134 = false;
  pIVar14 = (this->prices).data.
            super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->prices).data.
      super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar14) {
    (this->prices).data.
    super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar14;
  }
  (this->bestPrices).super_IdxSet.num = 0;
  lVar17 = (long)(pSVar16->infeasibilities).super_IdxSet.num;
  keys = pIVar14;
  local_1e8 = best;
  if (0 < lVar17) {
    uVar18 = lVar17 + 1;
    do {
      pSVar16 = (this->
                super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).thesolver;
      piVar13 = (pSVar16->infeasibilities).super_IdxSet.idx;
      iVar2 = piVar13[uVar18 - 2];
      local_238.data._M_elems._0_8_ = *(undefined8 *)&pnVar3[iVar2].m_backend.data;
      local_238.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar3[iVar2].m_backend.data + 8);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x10);
      local_238.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_238.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x20);
      local_238.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      local_238.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
      puVar1 = (uint *)((long)&pnVar3[iVar2].m_backend.data + 0x30);
      local_238.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      uVar4 = *(undefined8 *)(puVar1 + 2);
      local_238.data._M_elems._56_5_ = SUB85(uVar4,0);
      local_238.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
      local_238.exp = pnVar3[iVar2].m_backend.exp;
      local_238.neg = pnVar3[iVar2].m_backend.neg;
      local_238.fpclass = pnVar3[iVar2].m_backend.fpclass;
      local_238.prec_elem = pnVar3[iVar2].m_backend.prec_elem;
      result.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
      result.m_backend.data._M_elems._8_8_ = *(undefined8 *)((feastol->m_backend).data._M_elems + 2)
      ;
      result.m_backend.data._M_elems._16_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
      result.m_backend.data._M_elems._24_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
      result.m_backend.data._M_elems._32_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
      result.m_backend.data._M_elems._40_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
      result.m_backend.data._M_elems._48_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
      result.m_backend.data._M_elems._56_8_ =
           *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
      result.m_backend.exp = (feastol->m_backend).exp;
      result.m_backend.neg = (feastol->m_backend).neg;
      result.m_backend.fpclass = (feastol->m_backend).fpclass;
      result.m_backend.prec_elem = (feastol->m_backend).prec_elem;
      tol = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)(ulong)(result.m_backend.data._M_elems[0] | result.m_backend.fpclass);
      if ((result.m_backend.data._M_elems[0] | result.m_backend.fpclass) != cpp_dec_float_finite) {
        result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
      }
      if (local_238.fpclass == cpp_dec_float_NaN || result.m_backend.fpclass == cpp_dec_float_NaN) {
LAB_004621eb:
        iVar11 = (pSVar16->infeasibilities).super_IdxSet.num;
        (pSVar16->infeasibilities).super_IdxSet.num = iVar11 + -1;
        piVar13[uVar18 - 2] = piVar13[(long)iVar11 + -1];
        (pSVar16->isInfeasible).data[iVar2] = 0;
      }
      else {
        iVar11 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                           (&local_238,&result.m_backend);
        pSVar16 = (this->
                  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ).thesolver;
        if (-1 < iVar11) {
          piVar13 = (pSVar16->infeasibilities).super_IdxSet.idx;
          goto LAB_004621eb;
        }
        (pSVar16->isInfeasible).data[iVar2] = 1;
        uStack_50 = CONCAT35(local_238.data._M_elems[0xf]._1_3_,local_238.data._M_elems._56_5_);
        local_88 = (devexpr  [8])local_238.data._M_elems._0_8_;
        auStack_80[0] = local_238.data._M_elems[2];
        auStack_80[1] = local_238.data._M_elems[3];
        local_78[0] = local_238.data._M_elems[4];
        local_78[1] = local_238.data._M_elems[5];
        auStack_70[0] = local_238.data._M_elems[6];
        auStack_70[1] = local_238.data._M_elems[7];
        local_68[0] = local_238.data._M_elems[8];
        local_68[1] = local_238.data._M_elems[9];
        auStack_60[0] = local_238.data._M_elems[10];
        auStack_60[1] = local_238.data._M_elems[0xb];
        local_58[0] = local_238.data._M_elems[0xc];
        local_58[1] = local_238.data._M_elems[0xd];
        local_48 = local_238.exp;
        local_44 = local_238.neg;
        local_40 = local_238.fpclass;
        iStack_3c = local_238.prec_elem;
        local_d8.m_backend.data._M_elems._0_8_ = *(undefined8 *)&local_1e0[iVar2].m_backend.data;
        local_d8.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((long)&local_1e0[iVar2].m_backend.data + 8);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x10);
        local_d8.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x20);
        local_d8.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
        puVar1 = (uint *)((long)&local_1e0[iVar2].m_backend.data + 0x30);
        local_d8.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar1;
        local_d8.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
        local_d8.m_backend.exp = local_1e0[iVar2].m_backend.exp;
        local_d8.m_backend.neg = local_1e0[iVar2].m_backend.neg;
        local_d8.m_backend.fpclass = local_1e0[iVar2].m_backend.fpclass;
        local_d8.m_backend.prec_elem = local_1e0[iVar2].m_backend.prec_elem;
        local_128.m_backend.data._M_elems._0_8_ = *(undefined8 *)(feastol->m_backend).data._M_elems;
        local_128.m_backend.data._M_elems._8_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 2);
        local_128.m_backend.data._M_elems._16_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 4);
        local_128.m_backend.data._M_elems._24_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 6);
        local_128.m_backend.data._M_elems._32_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 8);
        local_128.m_backend.data._M_elems._40_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 10);
        local_128.m_backend.data._M_elems._48_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xc);
        local_128.m_backend.data._M_elems._56_8_ =
             *(undefined8 *)((feastol->m_backend).data._M_elems + 0xe);
        local_128.m_backend.exp = (feastol->m_backend).exp;
        local_128.m_backend.neg = (feastol->m_backend).neg;
        local_128.m_backend.fpclass = (feastol->m_backend).fpclass;
        local_128.m_backend.prec_elem = (feastol->m_backend).prec_elem;
        local_17c._0_4_ = iVar2;
        devexpr::
        computePrice<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  (&result,local_88,&local_d8,&local_128,tol);
        local_148[0] = result.m_backend.data._M_elems[0xc];
        local_148[1] = result.m_backend.data._M_elems[0xd];
        stack0xfffffffffffffec0 = result.m_backend.data._M_elems._56_5_;
        uStack_13b = result.m_backend.data._M_elems[0xf]._1_3_;
        local_158._8_4_ = result.m_backend.data._M_elems[10];
        local_158._12_4_ = result.m_backend.data._M_elems[0xb];
        local_158._0_4_ = result.m_backend.data._M_elems[8];
        local_158._4_4_ = result.m_backend.data._M_elems[9];
        local_168._8_4_ = result.m_backend.data._M_elems[6];
        local_168._12_4_ = result.m_backend.data._M_elems[7];
        local_168._0_4_ = result.m_backend.data._M_elems[4];
        local_168._4_4_ = result.m_backend.data._M_elems[5];
        auStack_170[0] = result.m_backend.data._M_elems[2];
        auStack_170[1] = result.m_backend.data._M_elems[3];
        local_17c._4_4_ = result.m_backend.data._M_elems[0];
        local_17c._8_4_ = result.m_backend.data._M_elems[1];
        iStack_138 = result.m_backend.exp;
        bStack_134 = result.m_backend.neg;
        local_130._0_4_ = result.m_backend.fpclass;
        local_130._4_4_ = result.m_backend.prec_elem;
        std::
        vector<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
        ::push_back(&(this->prices).data,(value_type *)local_17c);
      }
      uVar18 = uVar18 - 1;
    } while (1 < uVar18);
    keys = (this->prices).data.
           super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
    pIVar14 = (this->prices).data.
              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  DVar15.info = 0;
  DVar15.idx = -1;
  (this->
  super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).compare.elements = keys;
  uVar12 = SPxQuicksortPart<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
                     (keys,&(this->
                            super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).compare,0,(int)((ulong)((long)pIVar14 - (long)keys) >> 2) * 0x3cf3cf3d
                      ,100,0,0,true);
  if (0 < (int)uVar12) {
    pIVar14 = (this->prices).data.
              super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
              ._M_impl.super__Vector_impl_data._M_start;
    lVar17 = 0;
    do {
      DIdxSet::addIdx(&this->bestPrices,*(int *)((long)&(pIVar14->val).m_backend + lVar17 + -4));
      pIVar14 = (this->prices).data.
                super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      (((this->
        super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).thesolver)->isInfeasible).data[*(int *)((long)&(pIVar14->val).m_backend + lVar17 + -4)] =
           2;
      lVar17 = lVar17 + 0x54;
    } while ((ulong)uVar12 * 0x54 - lVar17 != 0);
    if (0 < (int)uVar12) {
      pIVar14 = (this->prices).data.
                super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar4 = *(undefined8 *)&(pIVar14->val).m_backend.data;
      uVar5 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 8);
      uVar6 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x10);
      uVar7 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x18);
      uVar8 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x20);
      uVar9 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x28);
      uVar10 = *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x38);
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 0xc) =
           *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x30);
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 0xe) = uVar10;
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 8) = uVar8;
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 10) = uVar9;
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 4) = uVar6;
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 6) = uVar7;
      *(undefined8 *)(local_1e8->m_backend).data._M_elems = uVar4;
      *(undefined8 *)((local_1e8->m_backend).data._M_elems + 2) = uVar5;
      (local_1e8->m_backend).exp = *(int *)((long)&(pIVar14->val).m_backend + 0x40);
      (local_1e8->m_backend).neg = *(bool *)((long)&(pIVar14->val).m_backend + 0x44);
      *(undefined8 *)&(local_1e8->m_backend).fpclass =
           *(undefined8 *)((long)&(pIVar14->val).m_backend + 0x48);
      DVar15 = (DataKey)SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::coId((this->
                               super_SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               ).thesolver,
                               ((this->prices).data.
                                super__Vector_base<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_std::allocator<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement>_>
                                ._M_impl.super__Vector_impl_data._M_start)->idx);
    }
  }
  return (SPxId)DVar15;
}

Assistant:

SPxId SPxDevexPR<R>::buildBestPriceVectorEnterDim(R& best, R feastol)
{
   int idx;
   int nsorted;
   R x;
   const R* coTest = this->thesolver->coTest().get_const_ptr();
   const R* cpen = this->thesolver->coWeights.get_const_ptr();
   typename SPxPricer<R>::IdxElement price;
   prices.clear();
   bestPrices.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilities.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilities.index(i);
      x = coTest[idx];

      if(x < -feastol)
      {
         this->thesolver->isInfeasible[idx] = this->VIOLATED;
         price.idx = idx;
         price.val = devexpr::computePrice(x, cpen[idx], feastol);
         prices.append(price);
      }
      else
      {
         this->thesolver->infeasibilities.remove(i);
         this->thesolver->isInfeasible[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < prices.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(prices[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(prices[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = prices.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(prices.get_ptr(), this->compare, 0, prices.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPrices.addIdx(prices[i].idx);
      this->thesolver->isInfeasible[prices[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = prices[0].val;
      return this->thesolver->coId(prices[0].idx);
   }
   else
      return SPxId();
}